

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

int POOL_resize(POOL_ctx *ctx,size_t numThreads)

{
  ZSTD_allocFunction p_Var1;
  int iVar2;
  pthread_t *ppVar3;
  ulong uVar4;
  int iVar5;
  
  if (ctx == (POOL_ctx *)0x0) {
    iVar5 = 1;
  }
  else {
    pthread_mutex_lock((pthread_mutex_t *)&ctx->queueMutex);
    if (ctx->threadCapacity < numThreads) {
      p_Var1 = (ctx->customMem).customAlloc;
      if (p_Var1 == (ZSTD_allocFunction)0x0) {
        ppVar3 = (pthread_t *)malloc(numThreads * 8);
      }
      else {
        ppVar3 = (pthread_t *)(*p_Var1)((ctx->customMem).opaque,numThreads * 8);
      }
      iVar5 = 1;
      if (ppVar3 != (pthread_t *)0x0) {
        memcpy(ppVar3,ctx->threads,ctx->threadCapacity << 3);
        ZSTD_free(ctx->threads,ctx->customMem);
        ctx->threads = ppVar3;
        uVar4 = ctx->threadCapacity;
        ppVar3 = ppVar3 + uVar4;
        for (; uVar4 < numThreads; uVar4 = uVar4 + 1) {
          iVar2 = pthread_create(ppVar3,(pthread_attr_t *)0x0,POOL_thread,ctx);
          if (iVar2 != 0) {
            ctx->threadCapacity = uVar4;
            goto LAB_00106ab7;
          }
          ppVar3 = ppVar3 + 1;
        }
        ctx->threadCapacity = numThreads;
        ctx->threadLimit = numThreads;
        iVar5 = 0;
      }
    }
    else if (numThreads == 0) {
      iVar5 = 1;
    }
    else {
      ctx->threadLimit = numThreads;
      iVar5 = 0;
    }
LAB_00106ab7:
    pthread_cond_broadcast((pthread_cond_t *)&ctx->queuePopCond);
    pthread_mutex_unlock((pthread_mutex_t *)&ctx->queueMutex);
  }
  return iVar5;
}

Assistant:

int POOL_resize(POOL_ctx* ctx, size_t numThreads)
{
    int result;
    if (ctx==NULL) return 1;
    ZSTD_pthread_mutex_lock(&ctx->queueMutex);
    result = POOL_resize_internal(ctx, numThreads);
    ZSTD_pthread_cond_broadcast(&ctx->queuePopCond);
    ZSTD_pthread_mutex_unlock(&ctx->queueMutex);
    return result;
}